

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O2

string * __thiscall
ritobin::io::json_impl::ErrorStack::trace_abi_cxx11_
          (string *__return_storage_ptr__,ErrorStack *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"read ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,this->type);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__," ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,this->message);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__," at ");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&this->path);
  return __return_storage_ptr__;
}

Assistant:

std::string trace() const noexcept {
            std::string result = {};
            result += "read ";
            result += this->type;
            result += " ";
            result += this->message;
            result += " at ";
            result += this->path;
            return result;
        }